

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *min,
          Instruction *max,Instruction *where)

{
  array<signed_char,_4UL> aVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  uint32_t id;
  int iVar4;
  int iVar5;
  array<signed_char,_4UL> aVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instruction *pIVar8;
  pointer *__ptr_1;
  long lVar9;
  pointer *__ptr_2;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  undefined1 local_200 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1e0;
  undefined1 local_1d8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_1b8;
  undefined1 local_1b0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_190;
  undefined1 local_188 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_168;
  undefined1 local_160 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_140;
  undefined4 local_138 [2];
  SmallVector<unsigned_int,_2UL> local_130;
  undefined4 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined4 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  aVar1._M_elems = (_Type)GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  id = 0;
  uVar2 = 0;
  if (x->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(x,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar7->_vptr_Type[9])(pTVar7);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  if (min->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(min,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,id);
  iVar4 = (*pTVar7->_vptr_Type[9])(pTVar7);
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24);
  uVar2 = 0;
  if (max->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(max,0);
  }
  pTVar7 = analysis::TypeManager::GetType(tm,uVar2);
  iVar5 = (*pTVar7->_vptr_Type[9])(pTVar7);
  if (iVar3 == iVar4) {
    if (iVar3 == *(int *)(CONCAT44(extraout_var_01,iVar5) + 0x24)) {
      aVar6._M_elems[0] = '\0';
      aVar6._M_elems[1] = '\0';
      aVar6._M_elems[2] = '\0';
      aVar6._M_elems[3] = '\0';
      uVar2 = 0;
      if (x->has_type_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(x,0);
      }
      local_160._24_8_ = local_160 + 0x10;
      local_160._0_8_ = &PTR__SmallVector_003d7c78;
      local_140._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_160._8_8_ = 1;
      local_138[0] = 1;
      local_130._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
      local_130.size_ = 0;
      local_130.small_data_ = (uint *)local_130.buffer;
      local_130.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_160._16_4_ = aVar1._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_130,(SmallVector<unsigned_int,_2UL> *)local_160);
      local_188._24_8_ = local_188 + 0x10;
      local_188._0_8_ = &PTR__SmallVector_003d7c78;
      local_168._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_188[0x10] = '-';
      local_188[0x11] = '\0';
      local_188[0x12] = '\0';
      local_188[0x13] = '\0';
      local_188._8_8_ = 1;
      local_108 = 7;
      local_100._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
      local_100.size_ = 0;
      local_100.small_data_ = (uint *)local_100.buffer;
      local_100.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_100,(SmallVector<unsigned_int,_2UL> *)local_188);
      if (x->has_result_id_ == true) {
        aVar6._M_elems = (_Type)Instruction::GetSingleWordOperand(x,(uint)x->has_type_id_);
      }
      local_1b0._24_8_ = local_1b0 + 0x10;
      local_1b0._0_8_ = &PTR__SmallVector_003d7c78;
      aVar1._M_elems[0] = '\0';
      aVar1._M_elems[1] = '\0';
      aVar1._M_elems[2] = '\0';
      aVar1._M_elems[3] = '\0';
      local_190._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_1b0._8_8_ = 1;
      local_d8 = 1;
      local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
      local_d0.size_ = 0;
      local_d0.small_data_ = (uint *)local_d0.buffer;
      local_d0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_1b0._16_4_ = aVar6._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_1b0);
      local_1d8[0x10] = '\0';
      local_1d8[0x11] = '\0';
      local_1d8[0x12] = '\0';
      local_1d8[0x13] = '\0';
      if (min->has_result_id_ == true) {
        local_1d8._16_4_ = Instruction::GetSingleWordOperand(min,(uint)min->has_type_id_);
      }
      local_1d8._24_8_ = local_1d8 + 0x10;
      local_1d8._0_8_ = &PTR__SmallVector_003d7c78;
      local_1b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_1d8._8_8_ = 1;
      local_a8 = 1;
      local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003d7c78;
      local_a0.size_ = 0;
      local_a0.small_data_ = (uint *)local_a0.buffer;
      local_a0.large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_1d8);
      if (max->has_result_id_ == true) {
        aVar1._M_elems = (_Type)Instruction::GetSingleWordOperand(max,(uint)max->has_type_id_);
      }
      local_200._24_8_ = local_200 + 0x10;
      local_200._0_8_ = &PTR__SmallVector_003d7c78;
      local_1e0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_200._8_8_ = 1;
      local_78 = 1;
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      local_70._8_8_ = 0;
      local_70._24_8_ = local_70 + 0x10;
      this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                &local_50;
      local_50._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_200._16_4_ = aVar1._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_70,
                 (SmallVector<unsigned_int,_2UL> *)local_200);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 local_138,&local_48);
      pIVar8 = InsertInst(this,where,OpExtInst,uVar2,result_id,(OperandList *)&local_48);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      lVar9 = -0xf0;
      do {
        *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_003d7c78;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
        }
        *(undefined8 *)this_00 = 0;
        this_00 = this_00 + -0x30;
        lVar9 = lVar9 + 0x30;
      } while (lVar9 != 0);
      local_200._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_1e0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl !=
          (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1e0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_1e0._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_1d8._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_1b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1b8,local_1b8._M_head_impl);
      }
      local_1b0._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_190._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_190,local_190._M_head_impl);
      }
      local_188._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_168._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_168,local_168._M_head_impl);
      }
      local_160._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_140._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_140,local_140._M_head_impl);
      }
      return pIVar8;
    }
    __assert_fail("xwidth == maxwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                  ,0x288,
                  "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
                 );
  }
  __assert_fail("xwidth == minwidth",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x287,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeSClampInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* min,
    Instruction* max, Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t clamp_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto minwidth = tm.GetType(min->type_id())->AsInteger()->width();
  const auto maxwidth = tm.GetType(max->type_id())->AsInteger()->width();
  assert(xwidth == minwidth);
  assert(xwidth == maxwidth);
  (void)xwidth;
  (void)minwidth;
  (void)maxwidth;
  auto* clamp_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), clamp_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450SClamp}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {min->result_id()}},
          {SPV_OPERAND_TYPE_ID, {max->result_id()}},
      });
  return clamp_inst;
}